

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_writeCTable_wksp
                 (void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog,
                 void *workspace,size_t workspaceSize)

{
  uint uVar1;
  uint *count;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  char cVar23;
  char cVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint uVar32;
  void *workspace_00;
  ulong uVar33;
  size_t sVar34;
  long lVar35;
  ulong uVar36;
  ulong srcSize;
  long lVar37;
  char *pcVar38;
  char *buffer;
  void *src;
  undefined1 auVar39 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  int iVar62;
  int iVar63;
  undefined1 auVar60 [16];
  int iVar64;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint local_7c;
  FSE_CTable *local_78;
  char *local_70;
  size_t local_68;
  uint local_5c;
  FSE_CTable *local_58;
  size_t local_50;
  size_t local_48;
  void *local_40;
  size_t local_38;
  
  local_70 = (char *)dst;
  local_68 = maxDstSize;
  workspace_00 = HUF_alignUpWorkspace(workspace,&workspaceSize,4);
  uVar33 = 0xffffffffffffffff;
  if ((0x2eb < workspaceSize) && (uVar33 = 0xffffffffffffffd2, maxSymbolValue < 0x100)) {
    *(undefined1 *)((long)workspace_00 + 0x1e0) = 0;
    auVar31 = _DAT_001e3900;
    auVar30 = _DAT_001e38f0;
    auVar29 = _DAT_001e3030;
    auVar28 = _DAT_001e3020;
    auVar27 = _DAT_001e3010;
    auVar26 = _DAT_001e3000;
    auVar25 = _DAT_001e2fc0;
    uVar1 = huffLog + 1;
    if (1 < uVar1) {
      lVar35 = (ulong)uVar1 - 2;
      auVar39._8_4_ = (int)lVar35;
      auVar39._0_8_ = lVar35;
      auVar39._12_4_ = (int)((ulong)lVar35 >> 0x20);
      lVar35 = 0;
      lVar37 = 0;
      do {
        auVar57._8_4_ = (int)lVar37;
        auVar57._0_8_ = lVar37;
        auVar57._12_4_ = (int)((ulong)lVar37 >> 0x20);
        auVar60 = auVar39 ^ auVar29;
        auVar65 = (auVar57 | auVar25) ^ auVar29;
        iVar59 = auVar60._0_4_;
        iVar78 = -(uint)(iVar59 < auVar65._0_4_);
        iVar62 = auVar60._4_4_;
        auVar67._4_4_ = -(uint)(iVar62 < auVar65._4_4_);
        iVar63 = auVar60._8_4_;
        iVar82 = -(uint)(iVar63 < auVar65._8_4_);
        iVar64 = auVar60._12_4_;
        auVar67._12_4_ = -(uint)(iVar64 < auVar65._12_4_);
        auVar40._4_4_ = iVar78;
        auVar40._0_4_ = iVar78;
        auVar40._8_4_ = iVar82;
        auVar40._12_4_ = iVar82;
        auVar40 = pshuflw(in_XMM1,auVar40,0xe8);
        auVar66._4_4_ = -(uint)(auVar65._4_4_ == iVar62);
        auVar66._12_4_ = -(uint)(auVar65._12_4_ == iVar64);
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar49 = pshuflw(in_XMM2,auVar66,0xe8);
        auVar67._0_4_ = auVar67._4_4_;
        auVar67._8_4_ = auVar67._12_4_;
        auVar65 = pshuflw(auVar40,auVar67,0xe8);
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0xffffffffffffffff;
        auVar60._12_4_ = 0xffffffff;
        auVar60 = (auVar65 | auVar49 & auVar40) ^ auVar60;
        auVar60 = packssdw(auVar60,auVar60);
        cVar23 = (char)huffLog;
        cVar24 = (char)lVar35;
        if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1e1) = cVar23 + cVar24;
        }
        auVar49._4_4_ = iVar78;
        auVar49._0_4_ = iVar78;
        auVar49._8_4_ = iVar82;
        auVar49._12_4_ = iVar82;
        auVar67 = auVar66 & auVar49 | auVar67;
        auVar60 = packssdw(auVar67,auVar67);
        auVar65._8_4_ = 0xffffffff;
        auVar65._0_8_ = 0xffffffffffffffff;
        auVar65._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar65,auVar60 ^ auVar65);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._0_4_ >> 8 & 1) != 0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1e2) = cVar23 + cVar24 + -1;
        }
        auVar60 = (auVar57 | auVar28) ^ auVar29;
        auVar50._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar50._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar50._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar50._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar68._4_4_ = auVar50._0_4_;
        auVar68._0_4_ = auVar50._0_4_;
        auVar68._8_4_ = auVar50._8_4_;
        auVar68._12_4_ = auVar50._8_4_;
        iVar78 = -(uint)(auVar60._4_4_ == iVar62);
        iVar82 = -(uint)(auVar60._12_4_ == iVar64);
        auVar11._4_4_ = iVar78;
        auVar11._0_4_ = iVar78;
        auVar11._8_4_ = iVar82;
        auVar11._12_4_ = iVar82;
        auVar79._4_4_ = auVar50._4_4_;
        auVar79._0_4_ = auVar50._4_4_;
        auVar79._8_4_ = auVar50._12_4_;
        auVar79._12_4_ = auVar50._12_4_;
        auVar60 = auVar11 & auVar68 | auVar79;
        auVar60 = packssdw(auVar60,auVar60);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar2,auVar60 ^ auVar2);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._0_4_ >> 0x10 & 1) != 0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1e3) = cVar23 + cVar24 + -2;
        }
        auVar60 = pshufhw(auVar60,auVar68,0x84);
        auVar12._4_4_ = iVar78;
        auVar12._0_4_ = iVar78;
        auVar12._8_4_ = iVar82;
        auVar12._12_4_ = iVar82;
        auVar65 = pshufhw(auVar50,auVar12,0x84);
        auVar40 = pshufhw(auVar60,auVar79,0x84);
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar41 = (auVar40 | auVar65 & auVar60) ^ auVar41;
        auVar60 = packssdw(auVar41,auVar41);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._0_4_ >> 0x18 & 1) != 0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1e4) = cVar23 + cVar24 + -3;
        }
        auVar60 = (auVar57 | auVar27) ^ auVar29;
        auVar51._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar51._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar51._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar51._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar13._4_4_ = auVar51._0_4_;
        auVar13._0_4_ = auVar51._0_4_;
        auVar13._8_4_ = auVar51._8_4_;
        auVar13._12_4_ = auVar51._8_4_;
        auVar65 = pshuflw(auVar79,auVar13,0xe8);
        auVar42._0_4_ = -(uint)(auVar60._0_4_ == iVar59);
        auVar42._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
        auVar42._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
        auVar42._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
        auVar69._4_4_ = auVar42._4_4_;
        auVar69._0_4_ = auVar42._4_4_;
        auVar69._8_4_ = auVar42._12_4_;
        auVar69._12_4_ = auVar42._12_4_;
        auVar60 = pshuflw(auVar42,auVar69,0xe8);
        auVar70._4_4_ = auVar51._4_4_;
        auVar70._0_4_ = auVar51._4_4_;
        auVar70._8_4_ = auVar51._12_4_;
        auVar70._12_4_ = auVar51._12_4_;
        auVar40 = pshuflw(auVar51,auVar70,0xe8);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 & auVar65,(auVar40 | auVar60 & auVar65) ^ auVar3);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1e5) = cVar23 + cVar24 + -4;
        }
        auVar14._4_4_ = auVar51._0_4_;
        auVar14._0_4_ = auVar51._0_4_;
        auVar14._8_4_ = auVar51._8_4_;
        auVar14._12_4_ = auVar51._8_4_;
        auVar70 = auVar69 & auVar14 | auVar70;
        auVar40 = packssdw(auVar70,auVar70);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60,auVar40 ^ auVar4);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._4_2_ >> 8 & 1) != 0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1e6) = cVar23 + cVar24 + -5;
        }
        auVar60 = (auVar57 | auVar26) ^ auVar29;
        auVar52._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar52._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar52._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar52._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar71._4_4_ = auVar52._0_4_;
        auVar71._0_4_ = auVar52._0_4_;
        auVar71._8_4_ = auVar52._8_4_;
        auVar71._12_4_ = auVar52._8_4_;
        iVar78 = -(uint)(auVar60._4_4_ == iVar62);
        iVar82 = -(uint)(auVar60._12_4_ == iVar64);
        auVar15._4_4_ = iVar78;
        auVar15._0_4_ = iVar78;
        auVar15._8_4_ = iVar82;
        auVar15._12_4_ = iVar82;
        auVar80._4_4_ = auVar52._4_4_;
        auVar80._0_4_ = auVar52._4_4_;
        auVar80._8_4_ = auVar52._12_4_;
        auVar80._12_4_ = auVar52._12_4_;
        auVar60 = auVar15 & auVar71 | auVar80;
        auVar60 = packssdw(auVar60,auVar60);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar5,auVar60 ^ auVar5);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1e7) = cVar23 + cVar24 + -6;
        }
        auVar60 = pshufhw(auVar60,auVar71,0x84);
        auVar16._4_4_ = iVar78;
        auVar16._0_4_ = iVar78;
        auVar16._8_4_ = iVar82;
        auVar16._12_4_ = iVar82;
        auVar65 = pshufhw(auVar52,auVar16,0x84);
        auVar40 = pshufhw(auVar60,auVar80,0x84);
        auVar43._8_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff;
        auVar43._12_4_ = 0xffffffff;
        auVar43 = (auVar40 | auVar65 & auVar60) ^ auVar43;
        auVar60 = packssdw(auVar43,auVar43);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._6_2_ >> 8 & 1) != 0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1e8) = cVar23 + cVar24 + -7;
        }
        auVar60 = (auVar57 | auVar31) ^ auVar29;
        auVar53._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar53._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar53._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar53._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar17._4_4_ = auVar53._0_4_;
        auVar17._0_4_ = auVar53._0_4_;
        auVar17._8_4_ = auVar53._8_4_;
        auVar17._12_4_ = auVar53._8_4_;
        auVar65 = pshuflw(auVar80,auVar17,0xe8);
        auVar44._0_4_ = -(uint)(auVar60._0_4_ == iVar59);
        auVar44._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
        auVar44._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
        auVar44._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
        auVar72._4_4_ = auVar44._4_4_;
        auVar72._0_4_ = auVar44._4_4_;
        auVar72._8_4_ = auVar44._12_4_;
        auVar72._12_4_ = auVar44._12_4_;
        auVar60 = pshuflw(auVar44,auVar72,0xe8);
        auVar73._4_4_ = auVar53._4_4_;
        auVar73._0_4_ = auVar53._4_4_;
        auVar73._8_4_ = auVar53._12_4_;
        auVar73._12_4_ = auVar53._12_4_;
        auVar40 = pshuflw(auVar53,auVar73,0xe8);
        auVar54._8_4_ = 0xffffffff;
        auVar54._0_8_ = 0xffffffffffffffff;
        auVar54._12_4_ = 0xffffffff;
        auVar54 = (auVar40 | auVar60 & auVar65) ^ auVar54;
        auVar40 = packssdw(auVar54,auVar54);
        auVar60 = packsswb(auVar60 & auVar65,auVar40);
        if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1e9) = cVar23 + cVar24 + -8;
        }
        auVar18._4_4_ = auVar53._0_4_;
        auVar18._0_4_ = auVar53._0_4_;
        auVar18._8_4_ = auVar53._8_4_;
        auVar18._12_4_ = auVar53._8_4_;
        auVar73 = auVar72 & auVar18 | auVar73;
        auVar40 = packssdw(auVar73,auVar73);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar40 = packssdw(auVar40 ^ auVar6,auVar40 ^ auVar6);
        auVar60 = packsswb(auVar60,auVar40);
        if ((auVar60._8_2_ >> 8 & 1) != 0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1ea) = cVar23 + cVar24 + -9;
        }
        auVar60 = (auVar57 | auVar30) ^ auVar29;
        auVar55._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar55._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar55._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar55._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar74._4_4_ = auVar55._0_4_;
        auVar74._0_4_ = auVar55._0_4_;
        auVar74._8_4_ = auVar55._8_4_;
        auVar74._12_4_ = auVar55._8_4_;
        iVar78 = -(uint)(auVar60._4_4_ == iVar62);
        iVar82 = -(uint)(auVar60._12_4_ == iVar64);
        auVar19._4_4_ = iVar78;
        auVar19._0_4_ = iVar78;
        auVar19._8_4_ = iVar82;
        auVar19._12_4_ = iVar82;
        auVar81._4_4_ = auVar55._4_4_;
        auVar81._0_4_ = auVar55._4_4_;
        auVar81._8_4_ = auVar55._12_4_;
        auVar81._12_4_ = auVar55._12_4_;
        auVar60 = auVar19 & auVar74 | auVar81;
        auVar60 = packssdw(auVar60,auVar60);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar7,auVar60 ^ auVar7);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1eb) = cVar23 + cVar24 + -10;
        }
        auVar60 = pshufhw(auVar60,auVar74,0x84);
        auVar20._4_4_ = iVar78;
        auVar20._0_4_ = iVar78;
        auVar20._8_4_ = iVar82;
        auVar20._12_4_ = iVar82;
        auVar65 = pshufhw(auVar55,auVar20,0x84);
        auVar40 = pshufhw(auVar60,auVar81,0x84);
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar45 = (auVar40 | auVar65 & auVar60) ^ auVar45;
        auVar60 = packssdw(auVar45,auVar45);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._10_2_ >> 8 & 1) != 0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1ec) = cVar23 + cVar24 + -0xb;
        }
        auVar60 = (auVar57 | _DAT_001e38e0) ^ auVar29;
        auVar56._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar56._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar56._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar56._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar21._4_4_ = auVar56._0_4_;
        auVar21._0_4_ = auVar56._0_4_;
        auVar21._8_4_ = auVar56._8_4_;
        auVar21._12_4_ = auVar56._8_4_;
        auVar65 = pshuflw(auVar81,auVar21,0xe8);
        auVar46._0_4_ = -(uint)(auVar60._0_4_ == iVar59);
        auVar46._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
        auVar46._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
        auVar46._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
        auVar75._4_4_ = auVar46._4_4_;
        auVar75._0_4_ = auVar46._4_4_;
        auVar75._8_4_ = auVar46._12_4_;
        auVar75._12_4_ = auVar46._12_4_;
        auVar60 = pshuflw(auVar46,auVar75,0xe8);
        auVar76._4_4_ = auVar56._4_4_;
        auVar76._0_4_ = auVar56._4_4_;
        auVar76._8_4_ = auVar56._12_4_;
        auVar76._12_4_ = auVar56._12_4_;
        auVar40 = pshuflw(auVar56,auVar76,0xe8);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 & auVar65,(auVar40 | auVar60 & auVar65) ^ auVar8);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1ed) = cVar23 + cVar24 + -0xc;
        }
        auVar22._4_4_ = auVar56._0_4_;
        auVar22._0_4_ = auVar56._0_4_;
        auVar22._8_4_ = auVar56._8_4_;
        auVar22._12_4_ = auVar56._8_4_;
        auVar76 = auVar75 & auVar22 | auVar76;
        auVar40 = packssdw(auVar76,auVar76);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60,auVar40 ^ auVar9);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60._12_2_ >> 8 & 1) != 0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1ee) = cVar23 + cVar24 + -0xd;
        }
        auVar60 = (auVar57 | _DAT_001e38d0) ^ auVar29;
        auVar47._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
        auVar47._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
        auVar47._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
        auVar47._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
        auVar77._4_4_ = auVar47._0_4_;
        auVar77._0_4_ = auVar47._0_4_;
        auVar77._8_4_ = auVar47._8_4_;
        auVar77._12_4_ = auVar47._8_4_;
        auVar58._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
        auVar58._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
        auVar58._0_4_ = auVar58._4_4_;
        auVar58._8_4_ = auVar58._12_4_;
        auVar61._4_4_ = auVar47._4_4_;
        auVar61._0_4_ = auVar47._4_4_;
        auVar61._8_4_ = auVar47._12_4_;
        auVar61._12_4_ = auVar47._12_4_;
        auVar40 = auVar58 & auVar77 | auVar61;
        auVar60 = packssdw(auVar47,auVar40);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar10,auVar60 ^ auVar10);
        auVar60 = packsswb(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1ef) = cVar23 + cVar24 + -0xe;
        }
        auVar60 = pshufhw(auVar60,auVar77,0x84);
        in_XMM2 = pshufhw(auVar40,auVar58,0x84);
        in_XMM2 = in_XMM2 & auVar60;
        auVar60 = pshufhw(auVar60,auVar61,0x84);
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar48 = (auVar60 | in_XMM2) ^ auVar48;
        auVar60 = packssdw(auVar48,auVar48);
        in_XMM1 = packsswb(auVar60,auVar60);
        if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
          *(char *)((long)workspace_00 + lVar37 + 0x1f0) = cVar23 + cVar24 + -0xf;
        }
        lVar37 = lVar37 + 0x10;
        lVar35 = lVar35 + -0x10;
      } while (-lVar35 != ((ulong)uVar1 + 0xe & 0xfffffffffffffff0));
    }
    srcSize = (ulong)maxSymbolValue;
    if (maxSymbolValue != 0) {
      uVar33 = 0;
      do {
        *(undefined1 *)((long)workspace_00 + uVar33 + 0x1ed) =
             *(undefined1 *)((long)workspace_00 + (ulong)(byte)CTable[uVar33 + 1] + 0x1e0);
        uVar33 = uVar33 + 1;
      } while (srcSize != uVar33);
    }
    uVar33 = 0xffffffffffffffba;
    if (local_68 != 0) {
      local_38 = 0x1e0;
      local_7c = 0xc;
      local_78 = (FSE_CTable *)HUF_alignUpWorkspace(workspace_00,&local_38,4);
      uVar33 = 0xffffffffffffffff;
      if (0x1df < local_38) {
        buffer = local_70 + 1;
        src = (void *)((long)workspace_00 + 0x1ed);
        if (1 < maxSymbolValue) {
          count = local_78 + 100;
          uVar32 = HIST_count_simple(count,&local_7c,src,srcSize);
          uVar1 = local_7c;
          if (uVar32 != 1 && uVar32 != maxSymbolValue) {
            local_40 = src;
            local_5c = FSE_optimalTableLog_internal(6,srcSize,local_7c,2);
            local_58 = local_78 + 0x71;
            sVar34 = FSE_normalizeCount((short *)local_58,local_5c,count,srcSize,uVar1,0);
            uVar32 = local_5c;
            if (0xffffffffffffff88 < sVar34) {
              return sVar34;
            }
            sVar34 = local_68 - 1;
            local_50 = FSE_writeNCount(buffer,sVar34,(short *)local_58,uVar1,local_5c);
            if (0xffffffffffffff88 < local_50) {
              return local_50;
            }
            local_48 = sVar34;
            sVar34 = FSE_buildCTable_wksp
                               (local_78,(short *)local_58,uVar1,uVar32,local_78 + 0x3b,0xa4);
            src = local_40;
            if (0xffffffffffffff88 < sVar34) {
              return sVar34;
            }
            pcVar38 = buffer + local_50;
            sVar34 = FSE_compress_usingCTable_generic
                               (pcVar38,local_48 - local_50,local_40,srcSize,local_78,
                                (uint)((maxSymbolValue >> 7) + srcSize + 0xc <= local_48 - local_50)
                               );
            if (0xffffffffffffff88 < sVar34) {
              return sVar34;
            }
            if (sVar34 != 0) {
              pcVar38 = pcVar38 + (sVar34 - (long)buffer);
              if ((char *)0xffffffffffffff88 < pcVar38) {
                return (size_t)pcVar38;
              }
              if (pcVar38 < (char *)(ulong)(maxSymbolValue >> 1) && (char *)0x1 < pcVar38) {
                *local_70 = (char)pcVar38;
                return (size_t)(pcVar38 + 1);
              }
            }
          }
        }
        uVar33 = 0xffffffffffffffff;
        if (maxSymbolValue < 0x81) {
          uVar36 = (ulong)((maxSymbolValue + 1 >> 1) + 1);
          uVar33 = 0xffffffffffffffba;
          if (uVar36 <= local_68) {
            *local_70 = (char)maxSymbolValue + '\x7f';
            *(undefined1 *)((long)src + srcSize) = 0;
            uVar33 = uVar36;
            if (maxSymbolValue != 0) {
              uVar36 = 0;
              do {
                *buffer = *(char *)((long)workspace_00 + uVar36 + 0x1ed) * '\x10' +
                          *(char *)((long)workspace_00 + uVar36 + 0x1ee);
                uVar36 = uVar36 + 2;
                buffer = buffer + 1;
              } while (uVar36 < srcSize);
            }
          }
        }
      }
    }
  }
  return uVar33;
}

Assistant:

size_t HUF_writeCTable_wksp(void* dst, size_t maxDstSize,
                            const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog,
                            void* workspace, size_t workspaceSize)
{
    HUF_CElt const* const ct = CTable + 1;
    BYTE* op = (BYTE*)dst;
    U32 n;
    HUF_WriteCTableWksp* wksp = (HUF_WriteCTableWksp*)HUF_alignUpWorkspace(workspace, &workspaceSize, ZSTD_ALIGNOF(U32));

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE >= sizeof(HUF_WriteCTableWksp));

    /* check conditions */
    if (workspaceSize < sizeof(HUF_WriteCTableWksp)) return ERROR(GENERIC);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    wksp->bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        wksp->bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        wksp->huffWeight[n] = wksp->bitsToWeight[HUF_getNbBits(ct[n])];

    /* attempt weights compression by FSE */
    if (maxDstSize < 1) return ERROR(dstSize_tooSmall);
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, wksp->huffWeight, maxSymbolValue, &wksp->wksp, sizeof(wksp->wksp)) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    wksp->huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((wksp->huffWeight[n] << 4) + wksp->huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}